

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::EncryptionAlgorithm::EncryptionAlgorithm(EncryptionAlgorithm *this)

{
  *(undefined ***)this = &PTR__EncryptionAlgorithm_004de690;
  AesGcmV1::AesGcmV1(&this->AES_GCM_V1);
  AesGcmCtrV1::AesGcmCtrV1(&this->AES_GCM_CTR_V1);
  this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset & 0xfc);
  return;
}

Assistant:

EncryptionAlgorithm::EncryptionAlgorithm() noexcept {
}